

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * google::protobuf::compiler::php::RootPhpNamespace<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *desc,bool is_descriptor)

{
  long lVar1;
  string *full_name;
  long *plVar2;
  long lVar3;
  
  lVar1 = *(long *)(*(long *)(desc + 0x10) + 0x88);
  if ((*(byte *)(lVar1 + 0x28) & 0x80) == 0) {
    full_name = *(string **)(*(long *)(desc + 0x10) + 8);
    if (full_name->_M_string_length != 0) {
      PhpName(__return_storage_ptr__,full_name,is_descriptor);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    plVar2 = *(long **)(lVar1 + 0x80);
    lVar1 = plVar2[1];
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (lVar1 != 0) {
      lVar3 = *plVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,lVar3,lVar1 + lVar3);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string RootPhpNamespace(const DescriptorType* desc, bool is_descriptor) {
  if (desc->file()->options().has_php_namespace()) {
    const string& php_namespace = desc->file()->options().php_namespace();
    if (!php_namespace.empty()) {
      return php_namespace;
    }
    return "";
  }

  if (!desc->file()->package().empty()) {
    return PhpName(desc->file()->package(), is_descriptor);
  }
  return "";
}